

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O3

void __thiscall llvm::Twine::Twine(Twine *this,char *Str)

{
  NodeKind NVar1;
  bool bVar2;
  
  this->LHSKind = EmptyKind;
  this->RHSKind = EmptyKind;
  if (*Str == '\0') {
    NVar1 = EmptyKind;
  }
  else {
    (this->LHS).cString = Str;
    NVar1 = CStringKind;
  }
  this->LHSKind = NVar1;
  bVar2 = isValid(this);
  if (bVar2) {
    return;
  }
  __assert_fail("isValid() && \"Invalid twine!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Twine.h"
                ,0x113,"llvm::Twine::Twine(const char *)");
}

Assistant:

Twine(const char *Str) {
      if (Str[0] != '\0') {
        LHS.cString = Str;
        LHSKind = CStringKind;
      } else
        LHSKind = EmptyKind;

      assert(isValid() && "Invalid twine!");
    }